

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

size_t __thiscall
anon_unknown.dwarf_372745::root_dir_start(anon_unknown_dwarf_372745 *this,StringRef str,Style style)

{
  char cVar1;
  char cVar2;
  size_type sVar3;
  int iVar4;
  char *pcVar5;
  StringRef Chars;
  StringRef str_local;
  
  str_local.Length = (size_t)str.Data;
  iVar4 = (int)str.Length;
  str_local.Data = (char *)this;
  if (((iVar4 == 0) && ((char *)0x2 < str_local.Length)) &&
     (cVar1 = llvm::StringRef::operator[](&str_local,1), cVar1 == ':')) {
    cVar1 = llvm::StringRef::operator[](&str_local,2);
    if (cVar1 == '/') {
      return 2;
    }
    if (cVar1 == '\\') {
      return 2;
    }
  }
  if (3 < str_local.Length) {
    cVar1 = llvm::StringRef::operator[](&str_local,0);
    if ((cVar1 == '/') || (iVar4 == 0 && cVar1 == '\\')) {
      cVar1 = llvm::StringRef::operator[](&str_local,0);
      cVar2 = llvm::StringRef::operator[](&str_local,1);
      if (cVar1 == cVar2) {
        cVar1 = llvm::StringRef::operator[](&str_local,2);
        if ((cVar1 != '/') && (iVar4 != 0 || cVar1 != '\\')) {
          pcVar5 = "/";
          if (iVar4 == 0) {
            pcVar5 = "\\/";
          }
          Chars.Length = (ulong)(iVar4 == 0) + 1;
          Chars.Data = pcVar5;
          sVar3 = llvm::StringRef::find_first_of(&str_local,Chars,2);
          return sVar3;
        }
      }
    }
  }
  if (str_local.Length != 0) {
    cVar1 = llvm::StringRef::operator[](&str_local,0);
    if (cVar1 == '/') {
      return 0;
    }
    if (iVar4 == 0 && cVar1 == '\\') {
      return 0;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t root_dir_start(StringRef str, Style style) {
    // case "c:/"
    if (real_style(style) == Style::windows) {
      if (str.size() > 2 && str[1] == ':' && is_separator(str[2], style))
        return 2;
    }

    // case "//net"
    if (str.size() > 3 && is_separator(str[0], style) && str[0] == str[1] &&
        !is_separator(str[2], style)) {
      return str.find_first_of(separators(style), 2);
    }

    // case "/"
    if (str.size() > 0 && is_separator(str[0], style))
      return 0;

    return StringRef::npos;
  }